

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O1

uint32_t * bcm2835_regbase(uint8_t regbase)

{
  undefined7 in_register_00000039;
  
  switch((int)CONCAT71(in_register_00000039,regbase)) {
  case 1:
  case 8:
    return bcm2835_st;
  case 2:
    return bcm2835_gpio;
  case 3:
    return bcm2835_pwm;
  case 4:
    return bcm2835_clk;
  case 5:
    return bcm2835_pads;
  case 6:
    return bcm2835_spi0;
  case 7:
    return bcm2835_bsc0;
  case 9:
    return bcm2835_aux;
  case 10:
    return bcm2835_spi1;
  default:
    return (uint32_t *)0xffffffffffffffff;
  }
}

Assistant:

uint32_t* bcm2835_regbase(uint8_t regbase)
{
    switch (regbase)
    {
	case BCM2835_REGBASE_ST:
	    return (uint32_t *)bcm2835_st;
	case BCM2835_REGBASE_GPIO:
	    return (uint32_t *)bcm2835_gpio;
	case BCM2835_REGBASE_PWM:
	    return (uint32_t *)bcm2835_pwm;
	case BCM2835_REGBASE_CLK:
	    return (uint32_t *)bcm2835_clk;
	case BCM2835_REGBASE_PADS:
	    return (uint32_t *)bcm2835_pads;
	case BCM2835_REGBASE_SPI0:
	    return (uint32_t *)bcm2835_spi0;
	case BCM2835_REGBASE_BSC0:
	    return (uint32_t *)bcm2835_bsc0;
	case BCM2835_REGBASE_BSC1:
	    return (uint32_t *)bcm2835_st;
	case BCM2835_REGBASE_AUX:
	    return (uint32_t *)bcm2835_aux;
	case BCM2835_REGBASE_SPI1:
	    return (uint32_t *)bcm2835_spi1;

    }
    return (uint32_t *)MAP_FAILED;
}